

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_SumExprPrecedence_Test::~ExprWriterTest_SumExprPrecedence_Test
          (ExprWriterTest_SumExprPrecedence_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, SumExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1), x3 = MakeVariable(2);
  NumericExpr args1[] = {x2, x3};
  NumericExpr args2[] = {x1, MakeIterated(ex::SUM, args1)};
  CHECK_WRITE("(x1 + (x2 + x3))",
              MakeIterated(ex::SUM, args2));
  NumericExpr args3[] = {x1, MakeBinary(ex::MUL, x2, x3)};
  CHECK_WRITE("(x1 + x2 * x3)", MakeIterated(ex::SUM, args3));
  NumericExpr args4[] = {MakeBinary(ex::ADD, x1, x2), x3};
  CHECK_WRITE("((x1 + x2) + x3)", MakeIterated(ex::SUM, args4));
}